

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loadlib.c
# Opt level: O3

int searcher_preload(lua_State *L)

{
  int iVar1;
  char *k;
  
  k = luaL_checklstring(L,1,(size_t *)0x0);
  lua_getfield(L,-0xf4628,"_PRELOAD");
  iVar1 = lua_getfield(L,-1,k);
  if (iVar1 == 0) {
    lua_pushfstring(L,"\n\tno field package.preload[\'%s\']",k);
  }
  return 1;
}

Assistant:

static int searcher_preload (lua_State *L) {
  const char *name = luaL_checkstring(L, 1);
  lua_getfield(L, LUA_REGISTRYINDEX, LUA_PRELOAD_TABLE);
  if (lua_getfield(L, -1, name) == LUA_TNIL)  /* not found? */
    lua_pushfstring(L, "\n\tno field package.preload['%s']", name);
  return 1;
}